

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O0

void do_medit(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int vnum;
  char *pcVar2;
  MOB_INDEX_DATA *pMVar3;
  AREA_DATA_conflict *pAVar4;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var5;
  char arg1 [4608];
  int value;
  AREA_DATA_conflict *pArea;
  MOB_INDEX_DATA *pMob;
  char *in_stack_00002630;
  CHAR_DATA *in_stack_00002638;
  char in_stack_ffffffffffffedd8;
  undefined7 in_stack_ffffffffffffedd9;
  char *in_stack_ffffffffffffede0;
  undefined4 in_stack_ffffffffffffede8;
  int in_stack_ffffffffffffedec;
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  
  bVar1 = check_security((CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8))
  ;
  if (bVar1) {
    pcVar2 = one_argument(in_stack_ffffffffffffede0,
                          (char *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    bVar1 = is_number((char *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    if (bVar1) {
      atoi(&stack0xffffffffffffedd8);
      pMVar3 = get_mob_index(in_stack_ffffffffffffedec);
      if (pMVar3 == (MOB_INDEX_DATA *)0x0) {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
      }
      else {
        bVar1 = is_switched(in_RDI);
        if ((bVar1) ||
           (((pMVar3->area->security < in_RDI->pcdata->security ||
             (pcVar2 = strstr(pMVar3->area->builders,in_RDI->name), pcVar2 == (char *)0x0)) &&
            ((in_RDI->pcdata->security <= pMVar3->area->security &&
             (pcVar2 = strstr(pMVar3->area->builders,"All"), pcVar2 == (char *)0x0)))))) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
        }
        else {
          in_RDI->desc->pEdit = pMVar3;
          in_RDI->desc->editor = 4;
          medit_show(in_stack_00002638,in_stack_00002630);
        }
      }
    }
    else {
      bVar1 = str_cmp(&stack0xffffffffffffedd8,"create");
      if (bVar1) {
        send_to_char(in_stack_ffffffffffffedf0,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
      }
      else {
        vnum = atoi(pcVar2);
        if ((in_stack_ffffffffffffedd8 == '\0') || (vnum == 0)) {
          send_to_char(in_stack_ffffffffffffedf0,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
        }
        else {
          pAVar4 = get_vnum_area(vnum);
          if (pAVar4 == (AREA_DATA_conflict *)0x0) {
            send_to_char(in_stack_ffffffffffffedf0,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8))
            ;
          }
          else {
            bVar1 = is_switched(in_RDI);
            if ((bVar1) ||
               ((((pAVar4->security < in_RDI->pcdata->security ||
                  (pcVar2 = strstr(pAVar4->builders,in_RDI->name), pcVar2 == (char *)0x0)) &&
                 (in_RDI->pcdata->security <= pAVar4->security)) &&
                (pcVar2 = strstr(pAVar4->builders,"All"), pcVar2 == (char *)0x0)))) {
              send_to_char(in_stack_ffffffffffffedf0,
                           (CHAR_DATA *)
                           CONCAT44(in_stack_ffffffffffffedec,in_stack_ffffffffffffede8));
            }
            else {
              bVar1 = medit_create(in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
              if (bVar1) {
                _Var5 = std::pow<int,int>(0,0x76f9b2);
                pAVar4->area_flags[0] = (long)_Var5 | pAVar4->area_flags[0];
                in_RDI->desc->editor = 4;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_medit(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	AREA_DATA *pArea;
	int value;
	char arg1[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	if (is_number(arg1))
	{
		value = atoi(arg1);
		if (!(pMob = get_mob_index(value)))
		{
			send_to_char("MEdit:  That vnum does not exist.\n\r", ch);
			return;
		}

		if (!IS_BUILDER(ch, pMob->area))
		{
			send_to_char("Insufficient security to modify mobs.\n\r", ch);
			return;
		}

		ch->desc->pEdit = (void *)pMob;
		ch->desc->editor = ED_MOBILE;

		medit_show(ch, "");
		return;
	}
	else
	{
		if (!str_cmp(arg1, "create"))
		{
			value = atoi(argument);

			if (arg1[0] == '\0' || value == 0)
			{
				send_to_char("Syntax:  edit mobile create [vnum]\n\r", ch);
				return;
			}

			pArea = get_vnum_area(value);

			if (!pArea)
			{
				send_to_char("MEdit:  That vnum is not assigned an area.\n\r", ch);
				return;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("Insufficient security to modify mobs.\n\r", ch);
				return;
			}

			if (medit_create(ch, argument))
			{
				SET_BIT(pArea->area_flags, AREA_CHANGED);
				ch->desc->editor = ED_MOBILE;
			}

			return;
		}
	}

	send_to_char("MEdit:  There is no default mobile to edit.\n\r", ch);
}